

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O2

void Gia_ManSweepComputeOneDomainEquivs
               (Gia_Man_t *p,Vec_Int_t *vRegClasses,int iDom,void *pParsS,int fConst,int fEquiv,
               int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vFfPerm;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar4;
  int i;
  
  iVar1 = Vec_IntFindMax(vRegClasses);
  if ((iDom < 1) || (iVar1 < iDom)) {
    __assert_fail("iDom >= 1 && iDom <= nDoms",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x265,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x266,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x267,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  vFfPerm = Vec_IntAlloc(p->nRegs);
  for (iVar1 = 0; iVar2 = vRegClasses->nSize, iVar1 < iVar2; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(vRegClasses,iVar1);
    if (iVar2 != iDom) {
      Vec_IntPush(vFfPerm,iVar1);
    }
  }
  iVar1 = vFfPerm->nSize;
  for (i = 0; i < iVar2; i = i + 1) {
    iVar2 = Vec_IntEntry(vRegClasses,i);
    if (iVar2 == iDom) {
      Vec_IntPush(vFfPerm,i);
    }
    iVar2 = vRegClasses->nSize;
  }
  iVar2 = vFfPerm->nSize;
  if (iVar2 != p->nRegs) {
    __assert_fail("Vec_IntSize(vPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x272,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  p_00 = Gia_ManDupPermFlop(p,vFfPerm);
  if (p_00->nObjs != p->nObjs) {
    __assert_fail("Gia_ManObjNum(pNew) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x275,
                  "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                 );
  }
  Vec_IntFree(vFfPerm);
  p_00->nRegs = iVar2 - iVar1;
  if (pParsS == (void *)0x0) {
    Gia_ManSeqCleanupClasses(p_00,fConst,fEquiv,fVerbose);
  }
  else {
    Cec_ManLSCorrespondenceClasses(p_00,(Cec_ParCor_t *)pParsS);
  }
  p_00->nRegs = p->nRegs;
  for (iVar1 = 0; iVar1 < p->nObjs; iVar1 = iVar1 + 1) {
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Abc_LitIsCompl(pGVar4->Value);
    if (iVar2 != 0) {
      __assert_fail("!Abc_LitIsCompl(pObj->Value)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                    ,0x281,
                    "void Gia_ManSweepComputeOneDomainEquivs(Gia_Man_t *, Vec_Int_t *, int, void *, int, int, int)"
                   );
    }
    uVar3 = Abc_Var2Lit(iVar1,0);
    iVar2 = Abc_Lit2Var(pGVar4->Value);
    pGVar4 = Gia_ManObj(p_00,iVar2);
    pGVar4->Value = uVar3;
  }
  Gia_ManDupRemapEquiv(p,p_00);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManSweepComputeOneDomainEquivs( Gia_Man_t * p, Vec_Int_t * vRegClasses, int iDom, void * pParsS, int fConst, int fEquiv, int fVerbose )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    Vec_Int_t * vPerm;
    int i, Class, nFlops;
    int nDoms = Vec_IntFindMax(vRegClasses);
    assert( iDom >= 1 && iDom <= nDoms );
    assert( p->pManTime == NULL );
    assert( Gia_ManRegNum(p) > 0 );
    // create required flop permutation
    vPerm = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class != iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize( vPerm );
    Vec_IntForEachEntry( vRegClasses, Class, i )
        if ( Class == iDom )
            Vec_IntPush( vPerm, i );
    nFlops = Vec_IntSize(vPerm) - nFlops;
    assert( Vec_IntSize(vPerm) == Gia_ManRegNum(p) );
    // derive new AIG
    pNew = Gia_ManDupPermFlop( p, vPerm );
    assert( Gia_ManObjNum(pNew) == Gia_ManObjNum(p) );
    Vec_IntFree( vPerm );
    // perform computation of equivalences 
    pNew->nRegs = nFlops;
    if ( pParsS )
        Cec_ManLSCorrespondenceClasses( pNew, (Cec_ParCor_t *)pParsS );
    else 
        Gia_ManSeqCleanupClasses( pNew, fConst, fEquiv, fVerbose );
    pNew->nRegs = Gia_ManRegNum(p);
    // make new point to old
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( !Abc_LitIsCompl(pObj->Value) );
        Gia_ManObj(pNew, Abc_Lit2Var(pObj->Value))->Value = Abc_Var2Lit(i, 0);
    }
    // transfer
    Gia_ManDupRemapEquiv( p, pNew );
    Gia_ManStop( pNew );
}